

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageLite *pMVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  undefined8 uVar3;
  void *pvVar4;
  __node_ptr p_Var5;
  _Hash_node_value<google::protobuf::internal::ExtensionInfo,_true> *p_Var6;
  ExtensionInfo info;
  key_type local_30;
  
  if ((anonymous_namespace)::global_registry ==
      (_Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)0x0) {
    p_Var6 = (_Hash_node_value<google::protobuf::internal::ExtensionInfo,_true> *)0x0;
  }
  else {
    pMVar1 = this->extendee_;
    local_30.type = '\0';
    local_30.is_repeated = false;
    local_30.is_packed = false;
    local_30.field_5.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
    local_30.field_5.enum_validity_check.arg = (void *)0x0;
    local_30.descriptor = (FieldDescriptor *)0x0;
    local_30.message._0_7_ = SUB87(pMVar1,0);
    local_30.message._7_1_ = (undefined1)((ulong)pMVar1 >> 0x38);
    local_30.number = number;
    p_Var5 = std::
             _Hashtable<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::ExtensionInfo,_std::allocator<google::protobuf::internal::ExtensionInfo>,_std::__detail::_Identity,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::_M_find_node((anonymous_namespace)::global_registry,
                            ((long)number ^ (ulong)pMVar1) %
                            (anonymous_namespace)::global_registry->_M_bucket_count,&local_30,
                            (long)number ^ (ulong)pMVar1);
    p_Var6 = &p_Var5->super__Hash_node_value<google::protobuf::internal::ExtensionInfo,_true>;
    if (p_Var5 == (__node_ptr)0x0) {
      p_Var6 = (_Hash_node_value<google::protobuf::internal::ExtensionInfo,_true> *)0x0;
    }
  }
  if (p_Var6 != (_Hash_node_value<google::protobuf::internal::ExtensionInfo,_true> *)0x0) {
    output->descriptor =
         *(FieldDescriptor **)
          ((long)&(p_Var6->super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>).
                  _M_storage._M_storage + 0x20);
    aVar2 = (p_Var6->super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>).
            _M_storage._M_storage.__align;
    uVar3 = *(undefined8 *)
             ((long)&(p_Var6->super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>
                     )._M_storage._M_storage + 8);
    pvVar4 = *(void **)((long)&(p_Var6->
                               super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>
                               )._M_storage._M_storage + 0x18);
    (output->field_5).enum_validity_check.func =
         *(EnumValidityFuncWithArg **)
          ((long)&(p_Var6->super__Hash_node_value_base<google::protobuf::internal::ExtensionInfo>).
                  _M_storage._M_storage + 0x10);
    (output->field_5).enum_validity_check.arg = pvVar4;
    output->message = (MessageLite *)aVar2;
    output->number = (int)uVar3;
    output->type = (char)((ulong)uVar3 >> 0x20);
    output->is_repeated = (bool)(char)((ulong)uVar3 >> 0x28);
    output->is_packed = (bool)(char)((ulong)uVar3 >> 0x30);
    output->field_0xf = (char)((ulong)uVar3 >> 0x38);
  }
  return p_Var6 != (_Hash_node_value<google::protobuf::internal::ExtensionInfo,_true> *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension = FindRegisteredExtension(extendee_, number);
  if (extension == nullptr) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}